

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void __thiscall
httplib::Server::write_response
          (Server *this,Stream *strm,bool last_connection,Request *req,Response *res)

{
  Response *this_00;
  Stream *pSVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int *args;
  ulong uVar5;
  unsigned_long __val;
  char *val;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool local_1aa;
  bool local_181;
  int local_174;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  string chunk;
  unsigned_long uStack_c8;
  bool data_available;
  uint64_t offset;
  undefined1 local_b8 [7];
  bool chunked_response;
  string length;
  string local_90;
  byte local_59;
  string local_58;
  char *local_38;
  Response *local_30;
  Response *res_local;
  Request *req_local;
  Stream *pSStack_18;
  bool last_connection_local;
  Stream *strm_local;
  Server *this_local;
  
  local_30 = res;
  res_local = (Response *)req;
  req_local._7_1_ = last_connection;
  pSStack_18 = strm;
  strm_local = (Stream *)this;
  if (res->status == -1) {
    __assert_fail("res.status != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ivanenko[P]ydisk_commander/httplib.h"
                  ,0x671,
                  "void httplib::Server::write_response(Stream &, bool, const Request &, Response &)"
                 );
  }
  if ((399 < res->status) &&
     (bVar2 = std::function::operator_cast_to_bool((function *)&this->error_handler_), bVar2)) {
    std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::operator()
              (&this->error_handler_,(Request *)res_local,local_30);
  }
  pSVar1 = pSStack_18;
  args = &local_30->status;
  local_38 = detail::status_message(local_30->status);
  Stream::write_format<int,char_const*>(pSVar1,"HTTP/1.1 %d %s\r\n",args,&local_38);
  local_59 = 0;
  local_181 = true;
  if ((req_local._7_1_ & 1) == 0) {
    Request::get_header_value_abi_cxx11_(&local_58,(Request *)res_local,"Connection",0);
    local_59 = 1;
    local_181 = std::operator==(&local_58,"close");
  }
  if ((local_59 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if (local_181 != false) {
    Response::set_header(local_30,"Connection","close");
  }
  length.field_2._M_local_buf[0xf] = '\0';
  local_1aa = false;
  if ((req_local._7_1_ & 1) == 0) {
    Request::get_header_value_abi_cxx11_(&local_90,(Request *)res_local,"Connection",0);
    length.field_2._M_local_buf[0xf] = '\x01';
    local_1aa = std::operator==(&local_90,"Keep-Alive");
  }
  if ((length.field_2._M_local_buf[0xf] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (local_1aa != false) {
    Response::set_header(local_30,"Connection","Keep-Alive");
  }
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    bVar2 = Response::has_header(local_30,"Content-Type");
    if (!bVar2) {
      Response::set_header(local_30,"Content-Type","text/plain");
    }
    __val = std::__cxx11::string::size();
    std::__cxx11::to_string((string *)local_b8,__val);
    this_00 = local_30;
    val = (char *)std::__cxx11::string::c_str();
    Response::set_header(this_00,"Content-Length",val);
    std::__cxx11::string::~string((string *)local_b8);
  }
  else {
    bVar2 = Response::has_header(local_30,"Content-Length");
    if (!bVar2) {
      bVar2 = std::function::operator_cast_to_bool((function *)&local_30->streamcb);
      if (bVar2) {
        Response::set_header(local_30,"Transfer-Encoding","chunked");
      }
      else {
        Response::set_header(local_30,"Content-Length","0");
      }
    }
  }
  detail::write_headers<httplib::Response>(pSStack_18,local_30);
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &res_local->status,"HEAD");
  if (bVar2) {
    uVar5 = std::__cxx11::string::empty();
    pSVar1 = pSStack_18;
    if ((uVar5 & 1) == 0) {
      uVar6 = std::__cxx11::string::c_str();
      uVar7 = std::__cxx11::string::size();
      (*pSVar1->_vptr_Stream[3])(pSVar1,uVar6,uVar7);
    }
    else {
      bVar2 = std::function::operator_cast_to_bool((function *)&local_30->streamcb);
      if (bVar2) {
        bVar2 = Response::has_header(local_30,"Content-Length");
        uStack_c8 = 0;
        chunk.field_2._M_local_buf[0xf] = '\x01';
        do {
          if ((chunk.field_2._M_local_buf[0xf] & 1U) == 0) break;
          std::
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(unsigned_long)>
          ::operator()((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0
                       ,&local_30->streamcb,uStack_c8);
          lVar8 = std::__cxx11::string::size();
          uStack_c8 = lVar8 + uStack_c8;
          bVar3 = std::__cxx11::string::empty();
          chunk.field_2._M_local_buf[0xf] = (bVar3 ^ 0xff) & 1;
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            auVar9 = std::__cxx11::string::size();
            detail::from_i_to_hex_abi_cxx11_(&local_170,auVar9._0_8_,auVar9._8_8_);
            std::operator+(&local_150,&local_170,"\r\n");
            std::operator+(&local_130,&local_150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_f0);
            std::operator+(&local_110,&local_130,"\r\n");
            std::__cxx11::string::operator=((string *)local_f0,(string *)&local_110);
            std::__cxx11::string::~string((string *)&local_110);
            std::__cxx11::string::~string((string *)&local_130);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
          }
          pSVar1 = pSStack_18;
          uVar6 = std::__cxx11::string::c_str();
          uVar7 = std::__cxx11::string::size();
          iVar4 = (*pSVar1->_vptr_Stream[3])(pSVar1,uVar6,uVar7);
          if (iVar4 < 0) {
            local_174 = 3;
          }
          else {
            local_174 = 0;
          }
          std::__cxx11::string::~string((string *)local_f0);
        } while (local_174 == 0);
      }
    }
  }
  bVar2 = std::function::operator_cast_to_bool((function *)&this->logger_);
  if (bVar2) {
    std::function<void_(const_httplib::Request_&,_const_httplib::Response_&)>::operator()
              (&this->logger_,(Request *)res_local,local_30);
  }
  return;
}

Assistant:

inline void Server::write_response(Stream& strm, bool last_connection, const Request& req, Response& res)
{
    assert(res.status != -1);

    if (400 <= res.status && error_handler_) {
        error_handler_(req, res);
    }

    // Response line
    strm.write_format("HTTP/1.1 %d %s\r\n",
        res.status,
        detail::status_message(res.status));

    // Headers
    if (last_connection ||
        req.get_header_value("Connection") == "close") {
        res.set_header("Connection", "close");
    }

    if (!last_connection &&
        req.get_header_value("Connection") == "Keep-Alive") {
        res.set_header("Connection", "Keep-Alive");
    }

    if (res.body.empty()) {
        if (!res.has_header("Content-Length")) {
            if (res.streamcb) {
                // Streamed response
                res.set_header("Transfer-Encoding", "chunked");
            } else {
                res.set_header("Content-Length", "0");
            }
        }
    } else {
#ifdef CPPHTTPLIB_ZLIB_SUPPORT
        // TODO: 'Accpet-Encoding' has gzip, not gzip;q=0
        const auto& encodings = req.get_header_value("Accept-Encoding");
        if (encodings.find("gzip") != std::string::npos &&
            detail::can_compress(res.get_header_value("Content-Type"))) {
            detail::compress(res.body);
            res.set_header("Content-Encoding", "gzip");
        }
#endif

        if (!res.has_header("Content-Type")) {
            res.set_header("Content-Type", "text/plain");
        }

        auto length = std::to_string(res.body.size());
        res.set_header("Content-Length", length.c_str());
    }

    detail::write_headers(strm, res);

    // Body
    if (req.method != "HEAD") {
        if (!res.body.empty()) {
            strm.write(res.body.c_str(), res.body.size());
        } else if (res.streamcb) {
            bool chunked_response = !res.has_header("Content-Length");
            uint64_t offset = 0;
            bool data_available = true;
            while (data_available) {
                std::string chunk = res.streamcb(offset);
                offset += chunk.size();
                data_available = !chunk.empty();
                // Emit chunked response header and footer for each chunk
                if (chunked_response)
                    chunk = detail::from_i_to_hex(chunk.size()) + "\r\n" + chunk + "\r\n";
                if (strm.write(chunk.c_str(), chunk.size()) < 0)
                    break;  // Stop on error
            }
        }
    }

    // Log
    if (logger_) {
        logger_(req, res);
    }
}